

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O2

int __thiscall
icu_63::HebrewCalendar::clone
          (HebrewCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  HebrewCalendar *this_00;
  
  this_00 = (HebrewCalendar *)UMemory::operator_new((UMemory *)0x268,(size_t)__fn);
  if (this_00 != (HebrewCalendar *)0x0) {
    HebrewCalendar(this_00,this);
  }
  return (int)this_00;
}

Assistant:

Calendar* HebrewCalendar::clone() const {
    return new HebrewCalendar(*this);
}